

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrint.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CoreMLModels::AudioFeaturePrint::MergeFrom
          (AudioFeaturePrint *this,AudioFeaturePrint *from)

{
  void *pvVar1;
  LogMessage *other;
  AudioFeaturePrint_Sound *this_00;
  AudioFeaturePrint_Sound *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/AudioFeaturePrint.pb.cc"
               ,0x1d7);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->_oneof_case_[0] != 0x14) {
    return;
  }
  if (this->_oneof_case_[0] == 0x14) {
    this_00 = (this->AudioFeaturePrintType_).sound_;
  }
  else {
    this->_oneof_case_[0] = 0x14;
    this_00 = (AudioFeaturePrint_Sound *)operator_new(0x18);
    AudioFeaturePrint_Sound::AudioFeaturePrint_Sound(this_00);
    (this->AudioFeaturePrintType_).sound_ = this_00;
    if (from->_oneof_case_[0] != 0x14) {
      protobuf_AudioFeaturePrint_2eproto::InitDefaults();
      from_00 = (AudioFeaturePrint_Sound *)&_AudioFeaturePrint_Sound_default_instance_;
      goto LAB_001cca47;
    }
  }
  from_00 = (from->AudioFeaturePrintType_).sound_;
LAB_001cca47:
  AudioFeaturePrint_Sound::MergeFrom(this_00,from_00);
  return;
}

Assistant:

void AudioFeaturePrint::MergeFrom(const AudioFeaturePrint& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CoreMLModels.AudioFeaturePrint)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.AudioFeaturePrintType_case()) {
    case kSound: {
      mutable_sound()->::CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound::MergeFrom(from.sound());
      break;
    }
    case AUDIOFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
}